

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::PackUnorm4x8CaseInstance::~PackUnorm4x8CaseInstance
          (PackUnorm4x8CaseInstance *this)

{
  ShaderPackingFunctionTestInstance::~ShaderPackingFunctionTestInstance
            (&this->super_ShaderPackingFunctionTestInstance);
  operator_delete(this,0xb0);
  return;
}

Assistant:

PackUnorm4x8CaseInstance (Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, glu::Precision precision, const char* name)
		: ShaderPackingFunctionTestInstance	(context, shaderType, spec, name)
		, m_precision						(precision)
	{
	}